

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::DOMNodeImpl::isDefaultNamespace(DOMNodeImpl *this,XMLCh *namespaceURI)

{
  DOMNodeImpl *currentNode;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar3;
  XMLCh *str2;
  DOMNode *pDVar4;
  undefined4 extraout_var_02;
  DOMNodeImpl *this_00;
  DOMElement *elem;
  undefined4 extraout_var_01;
  
  currentNode = (DOMNodeImpl *)this->fContainingNode;
  this_00 = currentNode;
  iVar2 = (*(code *)currentNode->fContainingNode[4]._vptr_DOMNode)();
  switch((short)iVar2) {
  case 1:
    iVar2 = (*(code *)currentNode->fContainingNode[0x17]._vptr_DOMNode)(currentNode);
    if (((short *)CONCAT44(extraout_var_00,iVar2) == (short *)0x0) ||
       (*(short *)CONCAT44(extraout_var_00,iVar2) == 0)) {
      iVar2 = (*(code *)currentNode->fContainingNode[0x16]._vptr_DOMNode)(currentNode);
      str2 = (XMLCh *)CONCAT44(extraout_var_02,iVar2);
LAB_00282527:
      bVar1 = XMLString::equals(namespaceURI,str2);
      return bVar1;
    }
    this_00 = currentNode;
    iVar2 = (*(code *)currentNode->fContainingNode[0x1a]._vptr_DOMNode)();
    if ((char)iVar2 != '\0') {
      this_00 = currentNode;
      iVar2 = (*(code *)currentNode->fContainingNode[0x33]._vptr_DOMNode)
                        (currentNode,XMLUni::fgXMLNSURIName,XMLUni::fgXMLNSString);
      plVar3 = (long *)CONCAT44(extraout_var_01,iVar2);
      if (plVar3 != (long *)0x0) {
        str2 = (XMLCh *)(**(code **)(*plVar3 + 0x18))(plVar3);
        goto LAB_00282527;
      }
    }
  default:
    pDVar4 = getElementAncestor(this_00,(DOMNode *)currentNode);
    if (pDVar4 != (DOMNode *)0x0) {
LAB_00282504:
      iVar2 = (*pDVar4->_vptr_DOMNode[0x24])(pDVar4,namespaceURI);
      return SUB41(iVar2,0);
    }
    break;
  case 2:
    iVar2 = (*this->fOwnerNode->_vptr_DOMNode[4])();
    if (iVar2 == 1) {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0x24])(this->fOwnerNode,namespaceURI);
      return SUB41(iVar2,0);
    }
    break;
  case 6:
  case 10:
  case 0xb:
  case 0xc:
    break;
  case 9:
    iVar2 = (*(code *)currentNode[-1].fContainingNode[0xd]._vptr_DOMNode)(currentNode + -1);
    pDVar4 = (DOMNode *)CONCAT44(extraout_var,iVar2);
    goto LAB_00282504;
  }
  return false;
}

Assistant:

bool DOMNodeImpl::isDefaultNamespace(const XMLCh* namespaceURI) const {
	const DOMNode *thisNode = getContainingNode();
    short type = thisNode->getNodeType();
    switch (type) {
    case DOMNode::ELEMENT_NODE: {
        const XMLCh *prefix = thisNode->getPrefix();

        // REVISIT: is it possible that prefix is empty string?
        if (prefix == 0 || !*prefix) {
            return XMLString::equals(namespaceURI, thisNode->getNamespaceURI());
        }

        if (thisNode->hasAttributes()) {
            DOMElement *elem = (DOMElement *)thisNode;
            DOMNode *attr = elem->getAttributeNodeNS(XMLUni::fgXMLNSURIName, XMLUni::fgXMLNSString);
            if (attr != 0) {
                const XMLCh *value = attr->getNodeValue();
                return XMLString::equals(namespaceURI, value);
            }
        }
        DOMNode *ancestor = getElementAncestor(thisNode);
        if (ancestor != 0) {
            return ancestor->isDefaultNamespace(namespaceURI);
        }

        return false;
    }
    case DOMNode::DOCUMENT_NODE:{
        return ((DOMDocument*)thisNode)->getDocumentElement()->isDefaultNamespace(namespaceURI);
    }

    case DOMNode::ENTITY_NODE :
    case DOMNode::NOTATION_NODE:
    case DOMNode::DOCUMENT_FRAGMENT_NODE:
    case DOMNode::DOCUMENT_TYPE_NODE:
        // type is unknown
        return false;
    case DOMNode::ATTRIBUTE_NODE:{
        if (fOwnerNode->getNodeType() == DOMNode::ELEMENT_NODE) {
            return fOwnerNode->isDefaultNamespace(namespaceURI);

        }
        return false;
    }
    default:{
        DOMNode *ancestor = getElementAncestor(thisNode);
        if (ancestor != 0) {
            return ancestor->isDefaultNamespace(namespaceURI);
        }
        return false;
    }

    }
}